

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O1

void __thiscall
TPZDohrAssembly<std::complex<double>_>::Write
          (TPZDohrAssembly<std::complex<double>_> *this,TPZStream *buf,int withclassid)

{
  long lVar1;
  long lVar2;
  int ncoarse;
  int nfine;
  int local_28;
  int local_24;
  
  local_24 = (int)(this->fFineEqs).fNElements;
  (*buf->_vptr_TPZStream[3])(buf,&local_24,1);
  if (0 < local_24) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      TPZStream::Write<int>
                (buf,(TPZVec<int> *)((long)&((this->fFineEqs).fStore)->_vptr_TPZVec + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar1 < local_24);
  }
  _local_28 = CONCAT44(local_24,(int)(this->fCoarseEqs).fNElements);
  (*buf->_vptr_TPZStream[3])(buf,&local_28,1);
  if (0 < local_28) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      TPZStream::Write<int>
                (buf,(TPZVec<int> *)((long)&((this->fCoarseEqs).fStore)->_vptr_TPZVec + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar1 < local_28);
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Write(TPZStream &buf, int withclassid) const
{
    int nfine = fFineEqs.size();
    buf.Write(&nfine,1);
    for (int f=0; f<nfine; f++) {
        buf.Write( fFineEqs[f]);
    }
    int ncoarse = fCoarseEqs.size();
    buf.Write(&ncoarse,1);
    for (int nc=0; nc<ncoarse; nc++) {
        buf.Write( fCoarseEqs[nc]);
    }
}